

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.h
# Opt level: O1

void __thiscall
chrono::ChLoaderXYZnode::ChLoaderXYZnode
          (ChLoaderXYZnode *this,shared_ptr<chrono::ChLoadableUVW> *mloadable)

{
  shared_ptr<chrono::ChLoadableUVW> local_18;
  
  local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mloadable->super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mloadable->super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChLoaderUVWatomic::ChLoaderUVWatomic(&this->super_ChLoaderUVWatomic,&local_18,0.0,0.0,0.0);
  if (local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ChLoaderUVWatomic).super_ChLoaderUVW.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderUVW_00b52b48;
  (this->force).m_data[0] = VNULL;
  (this->force).m_data[1] = DAT_00b90ac0;
  (this->force).m_data[2] = DAT_00b90ac8;
  return;
}

Assistant:

ChLoaderXYZnode(std::shared_ptr<ChLoadableUVW> mloadable) : ChLoaderUVWatomic(mloadable, 0, 0, 0), force(VNULL) {}